

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O0

DdNode * cuddBddVarMapRecur(DdManager *manager,DdNode *f)

{
  DdNode *f_00;
  DdNode *pDVar1;
  abctime aVar2;
  DdNode *h;
  DdNode *data;
  int index;
  DdNode *res;
  DdNode *E;
  DdNode *T;
  DdNode *F;
  DdNode *f_local;
  DdManager *manager_local;
  
  f_00 = (DdNode *)((ulong)f & 0xfffffffffffffffe);
  manager_local = (DdManager *)f;
  if (f_00->index != 0x7fffffff) {
    if ((f_00->ref == 1) ||
       (pDVar1 = cuddCacheLookup1(manager,Cudd_bddVarMap,f_00), pDVar1 == (DdNode *)0x0)) {
      if ((manager->TimeStop == 0) || (aVar2 = Abc_Clock(), aVar2 <= manager->TimeStop)) {
        pDVar1 = cuddBddVarMapRecur(manager,(f_00->type).kids.T);
        if (pDVar1 == (DdNode *)0x0) {
          manager_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
          h = cuddBddVarMapRecur(manager,(f_00->type).kids.E);
          if (h == (DdNode *)0x0) {
            Cudd_IterDerefBdd(manager,pDVar1);
            manager_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)h & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)h & 0xfffffffffffffffe) + 4) + 1;
            data = cuddBddIteRecur(manager,manager->vars[manager->map[f_00->index]],pDVar1,h);
            if (data == (DdNode *)0x0) {
              Cudd_IterDerefBdd(manager,pDVar1);
              Cudd_IterDerefBdd(manager,h);
              manager_local = (DdManager *)0x0;
            }
            else {
              *(int *)(((ulong)data & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)data & 0xfffffffffffffffe) + 4) + 1;
              Cudd_IterDerefBdd(manager,pDVar1);
              Cudd_IterDerefBdd(manager,h);
              if (f_00->ref != 1) {
                cuddCacheInsert1(manager,Cudd_bddVarMap,f_00,data);
              }
              *(int *)(((ulong)data & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)data & 0xfffffffffffffffe) + 4) + -1;
              manager_local = (DdManager *)((ulong)data ^ (long)(int)(uint)(f_00 != f));
            }
          }
        }
      }
      else {
        manager_local = (DdManager *)0x0;
      }
    }
    else {
      manager_local = (DdManager *)((ulong)pDVar1 ^ (long)(int)(uint)(f_00 != f));
    }
  }
  return &manager_local->sentinel;
}

Assistant:

static DdNode *
cuddBddVarMapRecur(
  DdManager *manager /* DD manager */,
  DdNode *f /* BDD to be remapped */)
{
    DdNode      *F, *T, *E;
    DdNode      *res;
    int         index;

    statLine(manager);
    F = Cudd_Regular(f);

    /* Check for terminal case of constant node. */
    if (cuddIsConstant(F)) {
        return(f);
    }

    /* If problem already solved, look up answer and return. */
    if (F->ref != 1 &&
        (res = cuddCacheLookup1(manager,Cudd_bddVarMap,F)) != NULL) {
        return(Cudd_NotCond(res,F != f));
    }

    if ( manager->TimeStop && Abc_Clock() > manager->TimeStop )
        return NULL;

    /* Split and recur on children of this node. */
    T = cuddBddVarMapRecur(manager,cuddT(F));
    if (T == NULL) return(NULL);
    cuddRef(T);
    E = cuddBddVarMapRecur(manager,cuddE(F));
    if (E == NULL) {
        Cudd_IterDerefBdd(manager, T);
        return(NULL);
    }
    cuddRef(E);

    /* Move variable that should be in this position to this position
    ** by retrieving the single var BDD for that variable, and calling
    ** cuddBddIteRecur with the T and E we just created.
    */
    index = manager->map[F->index];
    res = cuddBddIteRecur(manager,manager->vars[index],T,E);
    if (res == NULL) {
        Cudd_IterDerefBdd(manager, T);
        Cudd_IterDerefBdd(manager, E);
        return(NULL);
    }
    cuddRef(res);
    Cudd_IterDerefBdd(manager, T);
    Cudd_IterDerefBdd(manager, E);

    /* Do not keep the result if the reference count is only 1, since
    ** it will not be visited again.
    */
    if (F->ref != 1) {
        cuddCacheInsert1(manager,Cudd_bddVarMap,F,res);
    }
    cuddDeref(res);
    return(Cudd_NotCond(res,F != f));

}